

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitByBoneCountProcess.cpp
# Opt level: O3

void __thiscall
Assimp::SplitByBoneCountProcess::SplitMesh
          (SplitByBoneCountProcess *this,aiMesh *pMesh,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *poNewMeshes)

{
  pointer pvVar1;
  aiColor4D *paVar2;
  uint uVar3;
  aiBone *paVar4;
  iterator __position;
  aiVector3D *paVar5;
  bool bVar6;
  undefined1 *__src;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer puVar22;
  pointer puVar23;
  char *pcVar24;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Var25;
  aiMesh *paVar26;
  size_t sVar27;
  aiVector3D *paVar28;
  void *pvVar29;
  aiColor4D *paVar30;
  ulong *puVar31;
  aiFace *paVar32;
  uint *puVar33;
  aiBone **ppaVar34;
  aiBone *paVar35;
  aiVertexWeight *paVar36;
  pointer ppVar37;
  aiFace *paVar38;
  uint uVar39;
  ulong uVar40;
  uint c;
  pointer ppVar41;
  uint uVar42;
  vector<aiMesh*,std::allocator<aiMesh*>> *this_00;
  ulong uVar43;
  uint a;
  ulong uVar44;
  long lVar45;
  aiMesh *newMesh;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subMeshFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newBonesAtCurrentFace;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mappedBoneIndex;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  vertexBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> previousVertexIndices;
  uint local_2ac;
  aiMesh *local_2a8;
  uint local_2a0;
  allocator_type local_299;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  uint local_280;
  value_type_conflict1 local_27c;
  uint *local_278;
  iterator iStack_270;
  uint *local_268;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_258;
  vector<aiMesh*,std::allocator<aiMesh*>> *local_238;
  ulong local_230;
  vector<bool,_std::allocator<bool>_> local_228;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_200;
  vector<bool,_std::allocator<bool>_> local_1e8;
  char *local_1c0;
  SplitByBoneCountProcess *local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [16];
  pointer local_198;
  ios_base local_138 [264];
  
  if (this->mMaxBoneCount < (ulong)pMesh->mNumBones) {
    local_238 = (vector<aiMesh*,std::allocator<aiMesh*>> *)poNewMeshes;
    local_1b8 = this;
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::vector(&local_200,(ulong)pMesh->mNumVertices,(allocator_type *)local_1a8);
    uVar39 = pMesh->mNumBones;
    if (uVar39 != 0) {
      uVar44 = 0;
      do {
        paVar4 = pMesh->mBones[uVar44];
        if (paVar4->mNumWeights != 0) {
          uVar43 = 0;
          do {
            local_1a8._0_4_ = (undefined4)uVar44;
            local_1a8._4_4_ = paVar4->mWeights[uVar43].mWeight;
            std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
            ::emplace_back<std::pair<unsigned_int,float>>
                      ((vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>
                        *)(local_200.
                           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                          paVar4->mWeights[uVar43].mVertexId),(pair<unsigned_int,_float> *)local_1a8
                      );
            uVar43 = uVar43 + 1;
          } while (uVar43 < paVar4->mNumWeights);
          uVar39 = pMesh->mNumBones;
        }
        uVar44 = uVar44 + 1;
      } while (uVar44 < uVar39);
    }
    local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_228,(ulong)pMesh->mNumFaces,(bool *)local_1a8,(allocator_type *)&local_1e8);
    if (pMesh->mNumFaces != 0) {
      local_1c0 = (pMesh->mName).data;
      local_280 = 0;
      do {
        local_1a8._0_4_ = local_1a8._0_4_ & 0xffffff00;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_1e8,(ulong)pMesh->mNumBones,(bool *)local_1a8,(allocator_type *)&local_258
                  );
        local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (uint *)0x0;
        local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&local_298,(ulong)pMesh->mNumFaces);
        local_278 = (uint *)0x0;
        iStack_270._M_current = (uint *)0x0;
        local_268 = (uint *)0x0;
        local_1a8._0_4_ = 0;
        if (pMesh->mNumFaces == 0) {
          local_2ac = 0;
          local_2a0 = 0;
        }
        else {
          local_2a0 = 0;
          local_2ac = 0;
          uVar44 = 0;
          do {
            uVar39 = (uint)uVar44;
            if ((local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar44 >> 6] >>
                 (uVar44 & 0x3f) & 1) == 0) {
              paVar32 = pMesh->mFaces + uVar44;
              uVar39 = pMesh->mFaces[uVar44].mNumIndices;
              if (uVar39 != 0) {
                uVar44 = 0;
                do {
                  uVar42 = paVar32->mIndices[uVar44];
                  ppVar37 = local_200.
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar42].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (local_200.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar42].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != ppVar37) {
                    pvVar1 = local_200.
                             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar42;
                    uVar43 = 0;
                    uVar40 = 1;
                    do {
                      local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start._0_4_ = ppVar37[uVar43].first;
                      if (((local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                            [(uint)local_258.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 6] >>
                            ((ulong)(uint)local_258.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start & 0x3f) & 1) ==
                           0) && (_Var25 = std::
                                           __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                                     (local_278,iStack_270._M_current,
                                                      (allocator_type *)&local_258),
                                 _Var25._M_current == iStack_270._M_current)) {
                        if (_Var25._M_current == local_268) {
                          std::vector<unsigned_int,std::allocator<unsigned_int>>::
                          _M_realloc_insert<unsigned_int_const&>
                                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_278
                                     ,iStack_270,(uint *)&local_258);
                        }
                        else {
                          *iStack_270._M_current =
                               (uint)local_258.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          iStack_270._M_current = iStack_270._M_current + 1;
                        }
                      }
                      ppVar37 = (pvVar1->
                                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      bVar6 = uVar40 < (ulong)((long)(pvVar1->
                                                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppVar37 >> 3);
                      uVar43 = uVar40;
                      uVar40 = (ulong)((int)uVar40 + 1);
                    } while (bVar6);
                    uVar39 = paVar32->mNumIndices;
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar44 < uVar39);
              }
              uVar42 = local_2a0;
              uVar39 = local_1a8._0_4_;
              if (((long)iStack_270._M_current - (long)local_278 >> 2) + (ulong)local_2a0 <=
                  local_1b8->mMaxBoneCount) {
                while (local_278 != iStack_270._M_current) {
                  uVar39 = iStack_270._M_current[-1];
                  iStack_270._M_current = iStack_270._M_current + -1;
                  if ((local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar39 >> 6]
                       >> ((ulong)uVar39 & 0x3f) & 1) == 0) {
                    local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar39 >> 6] =
                         local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [uVar39 >> 6] | 1L << ((byte)uVar39 & 0x3f);
                    uVar42 = uVar42 + 1;
                  }
                }
                if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_298,
                             (iterator)
                             local_298.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)local_1a8);
                }
                else {
                  *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish = local_1a8._0_4_;
                  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_2ac = local_2ac + paVar32->mNumIndices;
                local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [(uint)local_1a8._0_4_ >> 6] =
                     local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(uint)local_1a8._0_4_ >> 6] | 1L << ((byte)local_1a8._0_4_ & 0x3f);
                local_280 = local_280 + 1;
                local_2a0 = uVar42;
                uVar39 = local_1a8._0_4_;
              }
            }
            local_1a8._0_4_ = uVar39 + 1;
            uVar44 = (ulong)(uint)local_1a8._0_4_;
          } while ((uint)local_1a8._0_4_ < pMesh->mNumFaces);
        }
        paVar26 = (aiMesh *)operator_new(0x520);
        paVar26->mPrimitiveTypes = 0;
        paVar26->mNumVertices = 0;
        paVar26->mNumFaces = 0;
        memset(&paVar26->mVertices,0,0xcc);
        paVar26->mBones = (aiBone **)0x0;
        paVar26->mMaterialIndex = 0;
        (paVar26->mName).length = 0;
        (paVar26->mName).data[0] = '\0';
        memset((paVar26->mName).data + 1,0x1b,0x3ff);
        paVar26->mNumAnimMeshes = 0;
        paVar26->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar26->mMethod = 0;
        (paVar26->mAABB).mMin.x = 0.0;
        (paVar26->mAABB).mMin.y = 0.0;
        (paVar26->mAABB).mMin.z = 0.0;
        (paVar26->mAABB).mMax.x = 0.0;
        (paVar26->mAABB).mMax.y = 0.0;
        (paVar26->mAABB).mMax.z = 0.0;
        memset(paVar26->mColors,0,0xa0);
        this_00 = local_238;
        local_2a8 = paVar26;
        if ((pMesh->mName).length != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          pcVar24 = local_1c0;
          sVar27 = strlen(local_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar24,sVar27);
          this_00 = local_238;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_sub",4);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__cxx11::stringbuf::str();
          puVar22 = local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          __src = (undefined1 *)
                  CONCAT44(local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)local_258.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
          if (local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish < (pointer)0x400) {
            (paVar26->mName).length =
                 (ai_uint32)
                 local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            memcpy((paVar26->mName).data,__src,
                   (size_t)local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
            (paVar26->mName).data[(long)puVar22] = '\0';
          }
          if ((pointer *)__src !=
              &local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            operator_delete(__src,(long)local_258.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        local_2a8->mMaterialIndex = pMesh->mMaterialIndex;
        local_2a8->mPrimitiveTypes = pMesh->mPrimitiveTypes;
        __position._M_current = *(aiMesh ***)(this_00 + 8);
        if (__position._M_current == *(aiMesh ***)(this_00 + 0x10)) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    (this_00,__position,&local_2a8);
        }
        else {
          *__position._M_current = local_2a8;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
        paVar26 = local_2a8;
        local_2a8->mNumVertices = local_2ac;
        local_2a8->mNumFaces =
             (uint)((ulong)((long)local_298.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_298.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2);
        uVar39 = local_2a8->mNumVertices;
        uVar44 = (ulong)uVar39 * 0xc;
        paVar28 = (aiVector3D *)operator_new__(uVar44);
        if (uVar39 != 0) {
          memset(paVar28,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar26->mVertices = paVar28;
        if ((pMesh->mNormals != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
          uVar39 = paVar26->mNumVertices;
          uVar44 = (ulong)uVar39 * 0xc;
          paVar28 = (aiVector3D *)operator_new__(uVar44);
          if (uVar39 != 0) {
            memset(paVar28,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar26->mNormals = paVar28;
        }
        if (((pMesh->mTangents != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0))
           && (pMesh->mNumVertices != 0)) {
          uVar39 = paVar26->mNumVertices;
          uVar44 = (ulong)uVar39 * 0xc;
          paVar28 = (aiVector3D *)operator_new__(uVar44);
          if (uVar39 != 0) {
            memset(paVar28,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar26->mTangents = paVar28;
          uVar39 = paVar26->mNumVertices;
          uVar44 = (ulong)uVar39 * 0xc;
          paVar28 = (aiVector3D *)operator_new__(uVar44);
          if (uVar39 != 0) {
            memset(paVar28,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
          }
          paVar26->mBitangents = paVar28;
        }
        lVar45 = 0;
        do {
          paVar26 = local_2a8;
          if ((*(long *)((long)pMesh->mTextureCoords + lVar45 * 2) != 0) &&
             (pMesh->mNumVertices != 0)) {
            uVar39 = local_2a8->mNumVertices;
            uVar44 = (ulong)uVar39 * 0xc;
            pvVar29 = operator_new__(uVar44);
            if (uVar39 != 0) {
              memset(pvVar29,0,((uVar44 - 0xc) / 0xc) * 0xc + 0xc);
            }
            *(void **)((long)paVar26->mTextureCoords + lVar45 * 2) = pvVar29;
          }
          *(undefined4 *)((long)local_2a8->mNumUVComponents + lVar45) =
               *(undefined4 *)((long)pMesh->mNumUVComponents + lVar45);
          lVar45 = lVar45 + 4;
        } while (lVar45 != 0x20);
        lVar45 = 0;
        do {
          paVar26 = local_2a8;
          if ((pMesh->mColors[lVar45] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
            uVar39 = local_2a8->mNumVertices;
            uVar44 = (ulong)uVar39 << 4;
            paVar30 = (aiColor4D *)operator_new__(uVar44);
            if (uVar39 != 0) {
              memset(paVar30,0,uVar44);
            }
            paVar26->mColors[lVar45] = paVar30;
          }
          puVar23 = local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar22 = local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar45 = lVar45 + 1;
        } while (lVar45 != 8);
        uVar44 = (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        puVar31 = (ulong *)operator_new__(-(ulong)(uVar44 >> 0x3c != 0) |
                                          ((long)local_298.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_298.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start) * 4 + 8U)
        ;
        *puVar31 = uVar44;
        paVar32 = (aiFace *)(puVar31 + 1);
        if (puVar23 != puVar22) {
          paVar38 = paVar32;
          do {
            paVar38->mNumIndices = 0;
            paVar38->mIndices = (uint *)0x0;
            paVar38 = paVar38 + 1;
          } while (paVar38 != paVar32 + uVar44);
        }
        local_2a8->mFaces = paVar32;
        uVar44 = (ulong)local_2ac;
        local_258.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8,uVar44,
                   (value_type_conflict1 *)&local_258,(allocator_type *)&local_27c);
        local_230 = uVar44;
        if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar39 = 0;
        }
        else {
          uVar44 = 0;
          uVar39 = 0;
          do {
            paVar32 = pMesh->mFaces;
            uVar42 = local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar44];
            paVar38 = local_2a8->mFaces;
            uVar3 = paVar32[uVar42].mNumIndices;
            paVar38[uVar44].mNumIndices = uVar3;
            local_1b0 = uVar44;
            puVar33 = (uint *)operator_new__((ulong)uVar3 << 2);
            paVar38 = paVar38 + uVar44;
            paVar38->mIndices = puVar33;
            if (paVar38->mNumIndices != 0) {
              uVar44 = 0;
              do {
                uVar3 = paVar32[uVar42].mIndices[uVar44];
                paVar38->mIndices[uVar44] = uVar39;
                uVar43 = (ulong)uVar39;
                *(uint *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + uVar43 * 4) = uVar3;
                paVar28 = pMesh->mVertices;
                paVar5 = local_2a8->mVertices;
                paVar5[uVar43].z = paVar28[uVar3].z;
                paVar28 = paVar28 + uVar3;
                fVar7 = paVar28->y;
                paVar5 = paVar5 + uVar43;
                paVar5->x = paVar28->x;
                paVar5->y = fVar7;
                paVar28 = pMesh->mNormals;
                if ((paVar28 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                  paVar5 = local_2a8->mNormals;
                  paVar5[uVar43].z = paVar28[uVar3].z;
                  fVar7 = paVar28[uVar3].y;
                  paVar5 = paVar5 + uVar43;
                  paVar5->x = paVar28[uVar3].x;
                  paVar5->y = fVar7;
                }
                paVar28 = pMesh->mTangents;
                if (((paVar28 != (aiVector3D *)0x0) && (pMesh->mBitangents != (aiVector3D *)0x0)) &&
                   (pMesh->mNumVertices != 0)) {
                  paVar5 = local_2a8->mTangents;
                  paVar5[uVar43].z = paVar28[uVar3].z;
                  fVar7 = paVar28[uVar3].y;
                  paVar5 = paVar5 + uVar43;
                  paVar5->x = paVar28[uVar3].x;
                  paVar5->y = fVar7;
                  paVar28 = pMesh->mBitangents;
                  paVar5 = local_2a8->mBitangents;
                  paVar5[uVar43].z = paVar28[uVar3].z;
                  paVar28 = paVar28 + uVar3;
                  fVar7 = paVar28->y;
                  paVar5 = paVar5 + uVar43;
                  paVar5->x = paVar28->x;
                  paVar5->y = fVar7;
                }
                lVar45 = 0;
                do {
                  paVar28 = pMesh->mTextureCoords[lVar45];
                  if ((paVar28 != (aiVector3D *)0x0) && (pMesh->mNumVertices != 0)) {
                    paVar5 = local_2a8->mTextureCoords[lVar45];
                    paVar5[uVar43].z = paVar28[uVar3].z;
                    fVar7 = paVar28[uVar3].y;
                    paVar5 = paVar5 + uVar43;
                    paVar5->x = paVar28[uVar3].x;
                    paVar5->y = fVar7;
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 8);
                lVar45 = 0;
                do {
                  if ((pMesh->mColors[lVar45] != (aiColor4D *)0x0) && (pMesh->mNumVertices != 0)) {
                    paVar30 = pMesh->mColors[lVar45] + uVar3;
                    fVar7 = paVar30->g;
                    fVar8 = paVar30->b;
                    fVar9 = paVar30->a;
                    paVar2 = local_2a8->mColors[lVar45] + uVar43;
                    paVar2->r = paVar30->r;
                    paVar2->g = fVar7;
                    paVar2->b = fVar8;
                    paVar2->a = fVar9;
                  }
                  lVar45 = lVar45 + 1;
                } while (lVar45 != 8);
                uVar39 = uVar39 + 1;
                uVar44 = uVar44 + 1;
              } while (uVar44 < paVar38->mNumIndices);
            }
            uVar44 = (ulong)((int)local_1b0 + 1);
          } while (uVar44 < (ulong)((long)local_298.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_298.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2));
        }
        uVar42 = local_2a0;
        paVar26 = local_2a8;
        if (uVar39 != local_2ac) {
          __assert_fail("nvi == numSubMeshVertices",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SplitByBoneCountProcess.cpp"
                        ,0x135,
                        "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                       );
        }
        local_2a8->mNumBones = 0;
        ppaVar34 = (aiBone **)operator_new__((ulong)local_2a0 << 3);
        paVar26->mBones = ppaVar34;
        local_27c = 0xffffffff;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_258,(ulong)pMesh->mNumBones,&local_27c,&local_299);
        uVar44 = (ulong)pMesh->mNumBones;
        if (pMesh->mNumBones != 0) {
          uVar43 = 0;
          do {
            if ((local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar43 >> 6] >>
                 (uVar43 & 0x3f) & 1) != 0) {
              paVar4 = pMesh->mBones[uVar43];
              paVar35 = (aiBone *)operator_new(0x460);
              (paVar35->mName).length = 0;
              (paVar35->mName).data[0] = '\0';
              memset((paVar35->mName).data + 1,0x1b,0x3ff);
              paVar35->mNumWeights = 0;
              paVar35->mWeights = (aiVertexWeight *)0x0;
              (paVar35->mOffsetMatrix).a1 = 1.0;
              (paVar35->mOffsetMatrix).a2 = 0.0;
              (paVar35->mOffsetMatrix).a3 = 0.0;
              (paVar35->mOffsetMatrix).a4 = 0.0;
              (paVar35->mOffsetMatrix).b1 = 0.0;
              (paVar35->mOffsetMatrix).b2 = 1.0;
              (paVar35->mOffsetMatrix).b3 = 0.0;
              (paVar35->mOffsetMatrix).b4 = 0.0;
              (paVar35->mOffsetMatrix).c1 = 0.0;
              (paVar35->mOffsetMatrix).c2 = 0.0;
              (paVar35->mOffsetMatrix).c3 = 1.0;
              (paVar35->mOffsetMatrix).c4 = 0.0;
              (paVar35->mOffsetMatrix).d1 = 0.0;
              (paVar35->mOffsetMatrix).d2 = 0.0;
              (paVar35->mOffsetMatrix).d3 = 0.0;
              (paVar35->mOffsetMatrix).d4 = 1.0;
              *(uint *)(CONCAT44(local_258.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_258.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) + uVar43 * 4) =
                   local_2a8->mNumBones;
              uVar39 = local_2a8->mNumBones;
              local_2a8->mNumBones = uVar39 + 1;
              local_2a8->mBones[uVar39] = paVar35;
              if (paVar35 != paVar4) {
                uVar39 = (paVar4->mName).length;
                (paVar35->mName).length = uVar39;
                memcpy((paVar35->mName).data,(paVar4->mName).data,(ulong)uVar39);
                (paVar35->mName).data[uVar39] = '\0';
              }
              fVar18 = (paVar4->mOffsetMatrix).a1;
              fVar19 = (paVar4->mOffsetMatrix).a2;
              fVar20 = (paVar4->mOffsetMatrix).a3;
              fVar21 = (paVar4->mOffsetMatrix).a4;
              fVar14 = (paVar4->mOffsetMatrix).b1;
              fVar15 = (paVar4->mOffsetMatrix).b2;
              fVar16 = (paVar4->mOffsetMatrix).b3;
              fVar17 = (paVar4->mOffsetMatrix).b4;
              fVar10 = (paVar4->mOffsetMatrix).c1;
              fVar11 = (paVar4->mOffsetMatrix).c2;
              fVar12 = (paVar4->mOffsetMatrix).c3;
              fVar13 = (paVar4->mOffsetMatrix).c4;
              fVar7 = (paVar4->mOffsetMatrix).d2;
              fVar8 = (paVar4->mOffsetMatrix).d3;
              fVar9 = (paVar4->mOffsetMatrix).d4;
              (paVar35->mOffsetMatrix).d1 = (paVar4->mOffsetMatrix).d1;
              (paVar35->mOffsetMatrix).d2 = fVar7;
              (paVar35->mOffsetMatrix).d3 = fVar8;
              (paVar35->mOffsetMatrix).d4 = fVar9;
              (paVar35->mOffsetMatrix).c1 = fVar10;
              (paVar35->mOffsetMatrix).c2 = fVar11;
              (paVar35->mOffsetMatrix).c3 = fVar12;
              (paVar35->mOffsetMatrix).c4 = fVar13;
              (paVar35->mOffsetMatrix).b1 = fVar14;
              (paVar35->mOffsetMatrix).b2 = fVar15;
              (paVar35->mOffsetMatrix).b3 = fVar16;
              (paVar35->mOffsetMatrix).b4 = fVar17;
              (paVar35->mOffsetMatrix).a1 = fVar18;
              (paVar35->mOffsetMatrix).a2 = fVar19;
              (paVar35->mOffsetMatrix).a3 = fVar20;
              (paVar35->mOffsetMatrix).a4 = fVar21;
              paVar35->mNumWeights = 0;
              uVar44 = (ulong)pMesh->mNumBones;
              uVar42 = local_2a0;
            }
            uVar43 = uVar43 + 1;
          } while (uVar43 < uVar44);
        }
        paVar26 = local_2a8;
        if (local_2a8->mNumBones != uVar42) {
          __assert_fail("newMesh->mNumBones == numBones",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SplitByBoneCountProcess.cpp"
                        ,0x14b,
                        "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                       );
        }
        if (local_2ac != 0) {
          uVar44 = 0;
          do {
            uVar39 = *(uint *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + uVar44 * 4);
            ppVar37 = local_200.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar39].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar41 = local_200.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar39].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar41 != ppVar37) {
              uVar42 = 1;
              uVar43 = 0;
              do {
                uVar43 = (ulong)*(uint *)(CONCAT44(local_258.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_258.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                         (ulong)ppVar37[uVar43].first * 4);
                if (uVar43 != 0xffffffff) {
                  puVar33 = &local_2a8->mBones[uVar43]->mNumWeights;
                  *puVar33 = *puVar33 + 1;
                  ppVar37 = local_200.
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar39].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ppVar41 = local_200.
                            super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar39].
                            super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                }
                uVar43 = (ulong)uVar42;
                uVar42 = uVar42 + 1;
              } while (uVar43 < (ulong)((long)ppVar41 - (long)ppVar37 >> 3));
            }
            uVar44 = uVar44 + 1;
          } while (uVar44 != local_230);
          uVar42 = local_2a8->mNumBones;
        }
        if (uVar42 != 0) {
          lVar45 = 0;
          do {
            paVar4 = paVar26->mBones[lVar45];
            if ((ulong)paVar4->mNumWeights == 0) {
              __assert_fail("bone->mNumWeights > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SplitByBoneCountProcess.cpp"
                            ,0x15f,
                            "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                           );
            }
            uVar44 = (ulong)paVar4->mNumWeights << 3;
            paVar36 = (aiVertexWeight *)operator_new__(uVar44);
            memset(paVar36,0,uVar44);
            paVar4->mWeights = paVar36;
            paVar4->mNumWeights = 0;
            lVar45 = lVar45 + 1;
          } while ((uint)lVar45 < paVar26->mNumBones);
        }
        if (local_2ac != 0) {
          uVar44 = 0;
          do {
            uVar39 = *(uint *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + uVar44 * 4);
            ppVar37 = local_200.
                      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar39].
                      super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_200.
                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar39].
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != ppVar37) {
              pvVar1 = local_200.
                       super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar39;
              uVar39 = 1;
              uVar43 = 0;
              do {
                uVar40 = (ulong)*(uint *)(CONCAT44(local_258.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_258.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                         (ulong)ppVar37[uVar43].first * 4);
                if (uVar40 == 0xffffffff) {
                  __assert_fail("newBoneIndex != std::numeric_limits<unsigned int>::max()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/SplitByBoneCountProcess.cpp"
                                ,0x170,
                                "void Assimp::SplitByBoneCountProcess::SplitMesh(const aiMesh *, std::vector<aiMesh *> &) const"
                               );
                }
                paVar4 = local_2a8->mBones[uVar40];
                paVar36 = paVar4->mWeights;
                uVar42 = paVar4->mNumWeights;
                paVar4->mNumWeights = uVar42 + 1;
                paVar36[uVar42].mVertexId = (uint)uVar44;
                paVar36[uVar42].mWeight =
                     (pvVar1->
                     super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar43].second;
                uVar43 = (ulong)uVar39;
                ppVar37 = (pvVar1->
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar39 = uVar39 + 1;
              } while (uVar43 < (ulong)((long)(pvVar1->
                                              super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppVar37 >> 3));
            }
            uVar44 = uVar44 + 1;
          } while (uVar44 != local_230);
        }
        pvVar29 = (void *)CONCAT44(local_258.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_258.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if (pvVar29 != (void *)0x0) {
          operator_delete(pvVar29,(long)local_258.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar29);
        }
        pvVar29 = (void *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_);
        if (pvVar29 != (void *)0x0) {
          operator_delete(pvVar29,(long)local_198 - (long)pvVar29);
        }
        if (local_278 != (uint *)0x0) {
          operator_delete(local_278,(long)local_268 - (long)local_278);
        }
        if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (uint *)0x0) {
          operator_delete(local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_298.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_298.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_1e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        }
      } while (local_280 < pMesh->mNumFaces);
    }
    if (local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_228.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
    }
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::~vector(&local_200);
  }
  return;
}

Assistant:

void SplitByBoneCountProcess::SplitMesh( const aiMesh* pMesh, std::vector<aiMesh*>& poNewMeshes) const
{
    // skip if not necessary
    if( pMesh->mNumBones <= mMaxBoneCount )
        return;

    // necessary optimisation: build a list of all affecting bones for each vertex
    // TODO: (thom) maybe add a custom allocator here to avoid allocating tens of thousands of small arrays
    typedef std::pair<unsigned int, float> BoneWeight;
    std::vector< std::vector<BoneWeight> > vertexBones( pMesh->mNumVertices);
    for( unsigned int a = 0; a < pMesh->mNumBones; ++a)
    {
        const aiBone* bone = pMesh->mBones[a];
        for( unsigned int b = 0; b < bone->mNumWeights; ++b)
            vertexBones[ bone->mWeights[b].mVertexId ].push_back( BoneWeight( a, bone->mWeights[b].mWeight));
    }

    unsigned int numFacesHandled = 0;
    std::vector<bool> isFaceHandled( pMesh->mNumFaces, false);
    while( numFacesHandled < pMesh->mNumFaces )
    {
        // which bones are used in the current submesh
        unsigned int numBones = 0;
        std::vector<bool> isBoneUsed( pMesh->mNumBones, false);
        // indices of the faces which are going to go into this submesh
        std::vector<unsigned int> subMeshFaces;
        subMeshFaces.reserve( pMesh->mNumFaces);
        // accumulated vertex count of all the faces in this submesh
        unsigned int numSubMeshVertices = 0;
        // a small local array of new bones for the current face. State of all used bones for that face
        // can only be updated AFTER the face is completely analysed. Thanks to imre for the fix.
        std::vector<unsigned int> newBonesAtCurrentFace;

        // add faces to the new submesh as long as all bones affecting the faces' vertices fit in the limit
        for( unsigned int a = 0; a < pMesh->mNumFaces; ++a)
        {
            // skip if the face is already stored in a submesh
            if( isFaceHandled[a] )
                continue;

            const aiFace& face = pMesh->mFaces[a];
            // check every vertex if its bones would still fit into the current submesh
            for( unsigned int b = 0; b < face.mNumIndices; ++b )
            {
                const std::vector<BoneWeight>& vb = vertexBones[face.mIndices[b]];
                for( unsigned int c = 0; c < vb.size(); ++c)
                {
                    unsigned int boneIndex = vb[c].first;
                    // if the bone is already used in this submesh, it's ok
                    if( isBoneUsed[boneIndex] )
                        continue;

                    // if it's not used, yet, we would need to add it. Store its bone index
                    if( std::find( newBonesAtCurrentFace.begin(), newBonesAtCurrentFace.end(), boneIndex) == newBonesAtCurrentFace.end() )
                        newBonesAtCurrentFace.push_back( boneIndex);
                }
            }

            // leave out the face if the new bones required for this face don't fit the bone count limit anymore
            if( numBones + newBonesAtCurrentFace.size() > mMaxBoneCount )
                continue;

            // mark all new bones as necessary
            while( !newBonesAtCurrentFace.empty() )
            {
                unsigned int newIndex = newBonesAtCurrentFace.back();
                newBonesAtCurrentFace.pop_back(); // this also avoids the deallocation which comes with a clear()
                if( isBoneUsed[newIndex] )
                    continue;

                isBoneUsed[newIndex] = true;
                numBones++;
            }

            // store the face index and the vertex count
            subMeshFaces.push_back( a);
            numSubMeshVertices += face.mNumIndices;

            // remember that this face is handled
            isFaceHandled[a] = true;
            numFacesHandled++;
        }

        // create a new mesh to hold this subset of the source mesh
        aiMesh* newMesh = new aiMesh;
        if( pMesh->mName.length > 0 )
            newMesh->mName.Set( format() << pMesh->mName.data << "_sub" << poNewMeshes.size());
        newMesh->mMaterialIndex = pMesh->mMaterialIndex;
        newMesh->mPrimitiveTypes = pMesh->mPrimitiveTypes;
        poNewMeshes.push_back( newMesh);

        // create all the arrays for this mesh if the old mesh contained them
        newMesh->mNumVertices = numSubMeshVertices;
        newMesh->mNumFaces = static_cast<unsigned int>(subMeshFaces.size());
        newMesh->mVertices = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasNormals() )
            newMesh->mNormals = new aiVector3D[newMesh->mNumVertices];
        if( pMesh->HasTangentsAndBitangents() )
        {
            newMesh->mTangents = new aiVector3D[newMesh->mNumVertices];
            newMesh->mBitangents = new aiVector3D[newMesh->mNumVertices];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a )
        {
            if( pMesh->HasTextureCoords( a) )
                newMesh->mTextureCoords[a] = new aiVector3D[newMesh->mNumVertices];
            newMesh->mNumUVComponents[a] = pMesh->mNumUVComponents[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a )
        {
            if( pMesh->HasVertexColors( a) )
                newMesh->mColors[a] = new aiColor4D[newMesh->mNumVertices];
        }

        // and copy over the data, generating faces with linear indices along the way
        newMesh->mFaces = new aiFace[subMeshFaces.size()];
        unsigned int nvi = 0; // next vertex index
        std::vector<unsigned int> previousVertexIndices( numSubMeshVertices, std::numeric_limits<unsigned int>::max()); // per new vertex: its index in the source mesh
        for( unsigned int a = 0; a < subMeshFaces.size(); ++a )
        {
            const aiFace& srcFace = pMesh->mFaces[subMeshFaces[a]];
            aiFace& dstFace = newMesh->mFaces[a];
            dstFace.mNumIndices = srcFace.mNumIndices;
            dstFace.mIndices = new unsigned int[dstFace.mNumIndices];

            // accumulate linearly all the vertices of the source face
            for( unsigned int b = 0; b < dstFace.mNumIndices; ++b )
            {
                unsigned int srcIndex = srcFace.mIndices[b];
                dstFace.mIndices[b] = nvi;
                previousVertexIndices[nvi] = srcIndex;

                newMesh->mVertices[nvi] = pMesh->mVertices[srcIndex];
                if( pMesh->HasNormals() )
                    newMesh->mNormals[nvi] = pMesh->mNormals[srcIndex];
                if( pMesh->HasTangentsAndBitangents() )
                {
                    newMesh->mTangents[nvi] = pMesh->mTangents[srcIndex];
                    newMesh->mBitangents[nvi] = pMesh->mBitangents[srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++c )
                {
                    if( pMesh->HasTextureCoords( c) )
                        newMesh->mTextureCoords[c][nvi] = pMesh->mTextureCoords[c][srcIndex];
                }
                for( unsigned int c = 0; c < AI_MAX_NUMBER_OF_COLOR_SETS; ++c )
                {
                    if( pMesh->HasVertexColors( c) )
                        newMesh->mColors[c][nvi] = pMesh->mColors[c][srcIndex];
                }

                nvi++;
            }
        }

        ai_assert( nvi == numSubMeshVertices );

        // Create the bones for the new submesh: first create the bone array
        newMesh->mNumBones = 0;
        newMesh->mBones = new aiBone*[numBones];

        std::vector<unsigned int> mappedBoneIndex( pMesh->mNumBones, std::numeric_limits<unsigned int>::max());
        for( unsigned int a = 0; a < pMesh->mNumBones; ++a )
        {
            if( !isBoneUsed[a] )
                continue;

            // create the new bone
            const aiBone* srcBone = pMesh->mBones[a];
            aiBone* dstBone = new aiBone;
            mappedBoneIndex[a] = newMesh->mNumBones;
            newMesh->mBones[newMesh->mNumBones++] = dstBone;
            dstBone->mName = srcBone->mName;
            dstBone->mOffsetMatrix = srcBone->mOffsetMatrix;
            dstBone->mNumWeights = 0;
        }

        ai_assert( newMesh->mNumBones == numBones );

        // iterate over all new vertices and count which bones affected its old vertex in the source mesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a )
        {
            unsigned int oldIndex = previousVertexIndices[a];
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[oldIndex];

            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b )
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                if( newBoneIndex != std::numeric_limits<unsigned int>::max() )
                    newMesh->mBones[newBoneIndex]->mNumWeights++;
            }
        }

        // allocate all bone weight arrays accordingly
        for( unsigned int a = 0; a < newMesh->mNumBones; ++a )
        {
            aiBone* bone = newMesh->mBones[a];
            ai_assert( bone->mNumWeights > 0 );
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            bone->mNumWeights = 0; // for counting up in the next step
        }

        // now copy all the bone vertex weights for all the vertices which made it into the new submesh
        for( unsigned int a = 0; a < numSubMeshVertices; ++a)
        {
            // find the source vertex for it in the source mesh
            unsigned int previousIndex = previousVertexIndices[a];
            // these bones were affecting it
            const std::vector<BoneWeight>& bonesOnThisVertex = vertexBones[previousIndex];
            // all of the bones affecting it should be present in the new submesh, or else
            // the face it comprises shouldn't be present
            for( unsigned int b = 0; b < bonesOnThisVertex.size(); ++b)
            {
                unsigned int newBoneIndex = mappedBoneIndex[ bonesOnThisVertex[b].first ];
                ai_assert( newBoneIndex != std::numeric_limits<unsigned int>::max() );
                aiVertexWeight* dstWeight = newMesh->mBones[newBoneIndex]->mWeights + newMesh->mBones[newBoneIndex]->mNumWeights;
                newMesh->mBones[newBoneIndex]->mNumWeights++;

                dstWeight->mVertexId = a;
                dstWeight->mWeight = bonesOnThisVertex[b].second;
            }
        }

        // I have the strange feeling that this will break apart at some point in time...
    }
}